

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_newtable(lua_State *L,CallInfo *ci,TValue *ra,int b,int c)

{
  uint nasize;
  uint nhsize;
  int iVar1;
  Table *t_00;
  Table *x_;
  TValue *io;
  Table *t;
  int c_local;
  int b_local;
  TValue *ra_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  t_00 = luaH_new(L);
  if (9 < (t_00->tt & 0xf)) {
    __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xaf2,"void raviV_op_newtable(lua_State *, CallInfo *, TValue *, int, int)");
  }
  (ra->value_).gc = (GCObject *)t_00;
  ra->tt_ = 0x8005;
  if ((ra->tt_ & 0x8000) != 0) {
    if ((ra->tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xaf2,"void raviV_op_newtable(lua_State *, CallInfo *, TValue *, int, int)");
    }
    if ((ra->tt_ & 0x7f) != (ushort)((ra->value_).gc)->tt) {
LAB_001630a4:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xaf2,"void raviV_op_newtable(lua_State *, CallInfo *, TValue *, int, int)");
    }
    if (L != (lua_State *)0x0) {
      if ((ra->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xaf2,"void raviV_op_newtable(lua_State *, CallInfo *, TValue *, int, int)");
      }
      if ((((ra->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_001630a4;
    }
  }
  if ((b != 0) || (c != 0)) {
    nasize = luaO_fb2int(b);
    nhsize = luaO_fb2int(c);
    luaH_resize(L,t_00,nasize,nhsize);
  }
  if (0 < L->l_G->GCdebt) {
    L->top = ra + 1;
    luaC_step(L);
    L->top = ci->top;
  }
  iVar1 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar1;
  if (iVar1 == 0) {
    iVar1 = **(int **)&L[-1].hookmask;
    **(int **)&L[-1].hookmask = iVar1 + 1;
    if (iVar1 == 0) {
      return;
    }
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xaf4,"void raviV_op_newtable(lua_State *, CallInfo *, TValue *, int, int)");
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0xaf4,"void raviV_op_newtable(lua_State *, CallInfo *, TValue *, int, int)");
}

Assistant:

void raviV_op_newtable(lua_State *L, CallInfo *ci, TValue *ra, int b, int c) {
  Table *t = luaH_new(L);
  sethvalue(L, ra, t);
  if (b != 0 || c != 0) luaH_resize(L, t, luaO_fb2int(b), luaO_fb2int(c));
  checkGC_(L, ra + 1);
}